

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-writer.c
# Opt level: O1

void test_bson_writer_null_realloc_2(void)

{
  char cVar1;
  undefined8 uVar2;
  int *extraout_RDX;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bson_t *b;
  uint8_t *buf;
  size_t buflen;
  undefined8 local_30;
  char *local_28;
  undefined8 local_20;
  
  local_28 = (char *)bson_malloc0(0x20);
  local_20 = 0x20;
  uVar2 = bson_writer_new(&local_28,&local_20,0,0,0);
  iVar3 = 5;
  do {
    cVar1 = bson_writer_begin(uVar2,&local_30);
    if (cVar1 == '\0') {
      test_bson_writer_null_realloc_2_cold_1();
      goto LAB_00136acf;
    }
    bson_writer_end(uVar2);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  cVar1 = bson_writer_begin(uVar2,&local_30);
  if (cVar1 == '\0') {
LAB_00136acf:
    test_bson_writer_null_realloc_2_cold_2();
  }
  else {
    cVar1 = bson_append_int32(local_30,"a",0xffffffff,0x7b);
    if (cVar1 == '\0') {
      bson_writer_end(uVar2);
      auVar5[0] = -(local_28[0x10] == '\0');
      auVar5[1] = -(local_28[0x11] == '\0');
      auVar5[2] = -(local_28[0x12] == '\0');
      auVar5[3] = -(local_28[0x13] == '\0');
      auVar5[4] = -(local_28[0x14] == '\x05');
      auVar5[5] = -(local_28[0x15] == '\0');
      auVar5[6] = -(local_28[0x16] == '\0');
      auVar5[7] = -(local_28[0x17] == '\0');
      auVar5[8] = -(local_28[0x18] == '\0');
      auVar5[9] = -(local_28[0x19] == '\x05');
      auVar5[10] = -(local_28[0x1a] == '\0');
      auVar5[0xb] = -(local_28[0x1b] == '\0');
      auVar5[0xc] = -(local_28[0x1c] == '\0');
      auVar5[0xd] = -(local_28[0x1d] == '\0');
      auVar5[0xe] = -(local_28[0x1e] == '\0');
      auVar5[0xf] = -(local_28[0x1f] == '\0');
      auVar4[0] = -(*local_28 == '\x05');
      auVar4[1] = -(local_28[1] == '\0');
      auVar4[2] = -(local_28[2] == '\0');
      auVar4[3] = -(local_28[3] == '\0');
      auVar4[4] = -(local_28[4] == '\0');
      auVar4[5] = -(local_28[5] == '\x05');
      auVar4[6] = -(local_28[6] == '\0');
      auVar4[7] = -(local_28[7] == '\0');
      auVar4[8] = -(local_28[8] == '\0');
      auVar4[9] = -(local_28[9] == '\0');
      auVar4[10] = -(local_28[10] == '\x05');
      auVar4[0xb] = -(local_28[0xb] == '\0');
      auVar4[0xc] = -(local_28[0xc] == '\0');
      auVar4[0xd] = -(local_28[0xd] == '\0');
      auVar4[0xe] = -(local_28[0xe] == '\0');
      auVar4[0xf] = -(local_28[0xf] == '\x05');
      auVar4 = auVar4 & auVar5;
      if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff) {
        bson_writer_destroy(uVar2);
        bson_free(local_28);
        return;
      }
      goto LAB_00136ad9;
    }
  }
  test_bson_writer_null_realloc_2_cold_4();
LAB_00136ad9:
  test_bson_writer_null_realloc_2_cold_3();
  *extraout_RDX = *extraout_RDX + 1;
  bson_realloc();
  return;
}

Assistant:

static void
test_bson_writer_null_realloc_2 (void)
{
   const uint8_t testdata[] = {5, 0, 0, 0, 0, 5, 0, 0, 0, 0, 5, 0, 0, 0, 0, 5,
                               0, 0, 0, 0, 5, 0, 0, 0, 0, 5, 0, 0, 0, 0, 0, 0};
   bson_writer_t *writer;
   uint8_t *buf = bson_malloc0 (32);
   size_t buflen = 32;
   bson_t *b;
   int r;
   int i;

   writer = bson_writer_new (&buf, &buflen, 0, NULL, NULL);
   for (i = 0; i < 5; i++) {
      BSON_ASSERT (bson_writer_begin (writer, &b));
      bson_writer_end (writer);
   }

   BSON_ASSERT (bson_writer_begin (writer, &b));
   BSON_ASSERT (!bson_append_int32 (b, "a", -1, 123));
   bson_writer_end (writer);

   r = memcmp (buf, testdata, 32);
   BSON_ASSERT (r == 0);
   bson_writer_destroy (writer);

   bson_free (buf);
}